

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

Fl_Widget * __thiscall Fl_Browser_Type::widget(Fl_Browser_Type *this,int x,int y,int w,int h)

{
  Fl_Browser *this_00;
  int i;
  uint uVar1;
  char buffer [20];
  
  this_00 = (Fl_Browser *)operator_new(0x2a0);
  Fl_Browser::Fl_Browser(this_00,x,y,w,h,(char *)0x0);
  if (batch_mode == 0) {
    for (uVar1 = 1; uVar1 != 0x15; uVar1 = uVar1 + 1) {
      sprintf(buffer,"Browser Line %d",(ulong)uVar1);
      Fl_Browser::add(this_00,buffer,(void *)0x0);
    }
  }
  return (Fl_Widget *)this_00;
}

Assistant:

Fl_Widget *widget(int x,int y,int w,int h) {
    Fl_Browser* b = new Fl_Browser(x,y,w,h);
    // Fl_Browser::add calls fl_height(), which requires the X display open.
    // Avoid this when compiling so it works w/o a display:
    if (!batch_mode) {
      char buffer[20];
      for (int i = 1; i <= 20; i++) {
	sprintf(buffer,"Browser Line %d",i);
	b->add(buffer);
      }
    }
    return b;
  }